

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripemd_test.cc
# Opt level: O2

void __thiscall RIPEMDTest_RunTest_Test::TestBody(RIPEMDTest_RunTest_Test *this)

{
  uchar *d;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> n;
  long lVar1;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> d_00;
  size_t done;
  _Head_base<0UL,_unsigned_char_*,_false> _Var2;
  char *pcVar3;
  _Head_base<0UL,_unsigned_char_*,_false> len;
  ScopedTrace gtest_trace_65;
  ScopedTrace gtest_trace_61;
  __array buf;
  Bytes local_e8;
  Bytes local_d8;
  uint8_t digest_1 [20];
  uint8_t digest [20];
  
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 0x20) {
    d = *(uchar **)(kRIPEMDTestCases[0].expected + lVar1 + -8);
    testing::ScopedTrace::ScopedTrace
              (&gtest_trace_61,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/ripemd/ripemd_test.cc"
               ,0x3d,(char *)d);
    n._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)strlen((char *)d);
    buf._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0;
    while( true ) {
      if ((ulong)n._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl <
          (ulong)buf._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl) break;
      testing::ScopedTrace::ScopedTrace<unsigned_long>
                (&gtest_trace_65,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/ripemd/ripemd_test.cc"
                 ,0x41,(unsigned_long *)&buf);
      if ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
          buf._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0) {
        RIPEMD160(d,(size_t)n._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,digest_1);
      }
      else {
        RIPEMD160_Init((RIPEMD160_CTX *)digest);
        for (_Var2._M_head_impl = (uchar *)0x0;
            len._M_head_impl =
                 (long)n._M_t.
                       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                       .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl -
                 _Var2._M_head_impl,
            _Var2._M_head_impl <=
            (ulong)n._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl &&
            (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)len._M_head_impl !=
            (_Head_base<0UL,_unsigned_char_*,_false>)0x0;
            _Var2._M_head_impl = _Var2._M_head_impl + len._M_head_impl) {
          if ((ulong)buf._M_t.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl < len._M_head_impl)
          {
            len._M_head_impl =
                 (uchar *)buf._M_t.
                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
          }
          RIPEMD160_Update((RIPEMD160_CTX *)digest,d + _Var2._M_head_impl,(size_t)len._M_head_impl);
        }
        RIPEMD160_Final(digest_1,(RIPEMD160_CTX *)digest);
      }
      local_e8.span_.data_ = digest_1;
      local_e8.span_.size_ = 0x14;
      local_d8.span_.size_ = 0x14;
      local_d8.span_.data_ = kRIPEMDTestCases[0].expected + lVar1;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)digest,"Bytes(digest)","Bytes(test.expected)",&local_e8,&local_d8);
      if (digest[0] == '\0') {
        testing::Message::Message((Message *)&local_e8);
        pcVar3 = "";
        if (digest._8_8_ != 0) {
          pcVar3 = *(char **)digest._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/ripemd/ripemd_test.cc"
                   ,0x58,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)&local_e8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
        if ((long *)local_e8.span_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_e8.span_.data_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(digest + 8));
      testing::ScopedTrace::~ScopedTrace(&gtest_trace_65);
      buf._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           ((long)buf._M_t.
                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 1);
    }
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_61);
  }
  d_00.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
       operator_new__(1000000);
  buf._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       d_00.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  memset((void *)d_00.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                 _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                 .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0x61,1000000);
  RIPEMD160((uchar *)d_00.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,1000000,digest);
  local_e8.span_.size_ = 0x14;
  local_d8.span_.data_ = TestBody::kMillionADigest;
  local_d8.span_.size_ = 0x14;
  local_e8.span_.data_ = digest;
  testing::internal::CmpHelperEQ<Bytes,Bytes>
            ((internal *)digest_1,"Bytes(digest)","Bytes(kMillionADigest)",&local_e8,&local_d8);
  if (digest_1[0] == '\0') {
    testing::Message::Message((Message *)&local_e8);
    std::operator<<((ostream *)((long)local_e8.span_.data_ + 0x10),
                    "Digest incorrect for \"million a\'s\" test");
    if (digest_1._8_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)digest_1._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/ripemd/ripemd_test.cc"
               ,0x65,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if ((long *)local_e8.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_e8.span_.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(digest_1 + 8));
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&buf);
  return;
}

Assistant:

TEST(RIPEMDTest, RunTest) {
  for (const auto &test : kRIPEMDTestCases) {
    SCOPED_TRACE(test.input);
    const size_t input_len = strlen(test.input);

    for (size_t stride = 0; stride <= input_len; stride++) {
      SCOPED_TRACE(stride);
      uint8_t digest[RIPEMD160_DIGEST_LENGTH];
      if (stride == 0) {
        RIPEMD160(reinterpret_cast<const uint8_t *>(test.input), input_len,
                  digest);
      } else {
        RIPEMD160_CTX ctx;
        RIPEMD160_Init(&ctx);

        for (size_t done = 0; done < input_len;) {
          const size_t remaining = input_len - done;
          size_t todo = stride;
          if (todo > remaining) {
            todo = remaining;
          }

          RIPEMD160_Update(&ctx, &test.input[done], todo);
          done += todo;
        }

        RIPEMD160_Final(digest, &ctx);
      }

      EXPECT_EQ(Bytes(digest), Bytes(test.expected));
    }
  }

  static const size_t kLargeBufSize = 1000000;
  auto buf = std::make_unique<uint8_t[]>(kLargeBufSize);
  OPENSSL_memset(buf.get(), 'a', kLargeBufSize);
  uint8_t digest[RIPEMD160_DIGEST_LENGTH];
  RIPEMD160(buf.get(), kLargeBufSize, digest);

  static const uint8_t kMillionADigest[RIPEMD160_DIGEST_LENGTH] = {
      0x52, 0x78, 0x32, 0x43, 0xc1, 0x69, 0x7b, 0xdb, 0xe1, 0x6d,
      0x37, 0xf9, 0x7f, 0x68, 0xf0, 0x83, 0x25, 0xdc, 0x15, 0x28};
  EXPECT_EQ(Bytes(digest), Bytes(kMillionADigest))
      << "Digest incorrect for \"million a's\" test";
}